

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::argSynopsis
          (CommandLine<Catch::ConfigData> *this,ostream *os)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  ostream *poVar4;
  logic_error *this_00;
  allocator local_51;
  string local_50 [32];
  _Self local_30;
  _Self local_28;
  const_iterator it;
  int i;
  ostream *os_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  it._M_node._4_4_ = 1;
  do {
    if (this->m_highestSpecifiedArgPosition < it._M_node._4_4_) {
      peVar3 = std::auto_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>::get
                         (&this->m_floatingArg);
      if (peVar3 != (element_type *)0x0) {
        if (1 < this->m_highestSpecifiedArgPosition) {
          std::operator<<(os," ");
        }
        poVar4 = std::operator<<(os,"[<");
        peVar3 = std::auto_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>::operator->
                           (&this->m_floatingArg);
        poVar4 = std::operator<<(poVar4,(string *)
                                        &(peVar3->super_CommonArgProperties<Catch::ConfigData>).
                                         placeholder);
        std::operator<<(poVar4,"> ...]");
      }
      return;
    }
    if (1 < it._M_node._4_4_) {
      std::operator<<(os," ");
    }
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::find(&this->m_positionalArgs,(key_type *)((long)&it._M_node + 4));
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         ::end(&this->m_positionalArgs);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      poVar4 = std::operator<<(os,"<");
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ::operator->(&local_28);
      poVar4 = std::operator<<(poVar4,(string *)(ppVar2 + 0x50));
      std::operator<<(poVar4,">");
    }
    else {
      peVar3 = std::auto_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>::get
                         (&this->m_floatingArg);
      if (peVar3 == (element_type *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_50,"non consecutive positional arguments with no floating args",&local_51);
        std::logic_error::logic_error(this_00,local_50);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar4 = std::operator<<(os,"<");
      peVar3 = std::auto_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>::operator->
                         (&this->m_floatingArg);
      poVar4 = std::operator<<(poVar4,(string *)
                                      &(peVar3->super_CommonArgProperties<Catch::ConfigData>).
                                       placeholder);
      std::operator<<(poVar4,">");
    }
    it._M_node._4_4_ = it._M_node._4_4_ + 1;
  } while( true );
}

Assistant:

void argSynopsis( std::ostream& os ) const {
            for( int i = 1; i <= m_highestSpecifiedArgPosition; ++i ) {
                if( i > 1 )
                    os << " ";
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( i );
                if( it != m_positionalArgs.end() )
                    os << "<" << it->second.placeholder << ">";
                else if( m_floatingArg.get() )
                    os << "<" << m_floatingArg->placeholder << ">";
                else
                    throw std::logic_error( "non consecutive positional arguments with no floating args" );
            }
            // !TBD No indication of mandatory args
            if( m_floatingArg.get() ) {
                if( m_highestSpecifiedArgPosition > 1 )
                    os << " ";
                os << "[<" << m_floatingArg->placeholder << "> ...]";
            }
        }